

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_pillar.cpp
# Opt level: O2

void __thiscall DPillar::Destroy(DPillar *this)

{
  TObjPtr<DInterpolation> *pTVar1;
  DInterpolation *pDVar2;
  
  pTVar1 = &this->m_Interp_Ceiling;
  pDVar2 = GC::ReadBarrier<DInterpolation>((DInterpolation **)pTVar1);
  if (pDVar2 != (DInterpolation *)0x0) {
    pDVar2 = GC::ReadBarrier<DInterpolation>((DInterpolation **)pTVar1);
    DInterpolation::DelRef(pDVar2,false);
    (pTVar1->field_0).p = (DInterpolation *)0x0;
  }
  pTVar1 = &this->m_Interp_Floor;
  pDVar2 = GC::ReadBarrier<DInterpolation>((DInterpolation **)pTVar1);
  if (pDVar2 != (DInterpolation *)0x0) {
    pDVar2 = GC::ReadBarrier<DInterpolation>((DInterpolation **)pTVar1);
    DInterpolation::DelRef(pDVar2,false);
    (pTVar1->field_0).p = (DInterpolation *)0x0;
  }
  DMover::Destroy(&this->super_DMover);
  return;
}

Assistant:

void DPillar::Destroy()
{
	if (m_Interp_Ceiling != NULL)
	{
		m_Interp_Ceiling->DelRef();
		m_Interp_Ceiling = NULL;
	}
	if (m_Interp_Floor != NULL)
	{
		m_Interp_Floor->DelRef();
		m_Interp_Floor = NULL;
	}
	Super::Destroy();
}